

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles31::Functional::PackHalf2x16Case::iterate(PackHalf2x16Case *this)

{
  uint uVar1;
  ShaderExecutor *pSVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  Float<unsigned_int,_8,_23,_127,_3U> FVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  char *description;
  uint uVar13;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  pointer pVVar14;
  int ndx;
  int iVar15;
  int c;
  long lVar16;
  int local_21c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  ostringstream local_1a8 [376];
  
  dVar6 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6 ^ 0x776002);
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in = (void *)0x0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f8000003f000000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f0000003f800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3fc00000bf000000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  in = (void *)0x3f4000003e800000;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&inputs,
             (Vector<float,_2> *)&in);
  for (iVar15 = 0; iVar15 != 0x5f; iVar15 = iVar15 + 1) {
    in = (void *)0x0;
    for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
      bVar5 = de::Random::getBool((Random *)&rnd.m_rnd);
      dVar6 = deRandom_getUint32(&rnd.m_rnd);
      dVar7 = deRandom_getUint32(&rnd.m_rnd);
      FVar8 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                        (bVar5 - 1 | 1,(dVar6 % 0x1e - 0xe) + (uint)(dVar6 % 0x1e == 0xe),
                         dVar7 & 0x7fffff | 0x800000);
      *(StorageType *)(local_1a8 + lVar16 * 4 + -8) = FVar8.m_value;
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (&inputs,(value_type *)&in);
  }
  lVar16 = -(long)inputs.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  for (pVVar14 = inputs.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pVVar14 !=
      inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish; pVVar14 = pVVar14 + 1) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&in,pVVar14->m_data[0]);
    FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&in);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&out,pVVar14->m_data[1]);
    FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                      ((Float<unsigned_short,_5,_10,_15,_3U> *)&out);
    pVVar14->m_data[0] = (float)FVar8.m_value;
    pVVar14->m_data[1] = (float)FVar9.m_value;
    lVar16 = lVar16 + -8;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&outputs,-((long)(inputs.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar16) >> 3);
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  in = inputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar2->_vptr_ShaderExecutor[6])
            (pSVar2,(ulong)((long)inputs.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3,&in,&out);
  uVar12 = (long)inputs.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)inputs.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  local_21c = 0;
  for (lVar16 = 0;
      lVar16 < (int)((ulong)((long)inputs.
                                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)inputs.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      lVar16 = lVar16 + 1) {
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&in,
               inputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar16].m_data[0]);
    uVar3 = (ushort)in;
    uVar13 = (uint)(ushort)in;
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)&in,
               inputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar16].m_data[1]);
    uVar4 = (ushort)in;
    uVar1 = outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16];
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar1;
    iVar10 = uVar13 - (uVar1 & 0xffff);
    iVar15 = -iVar10;
    if (0 < iVar10) {
      iVar15 = iVar10;
    }
    iVar11 = (uint)(ushort)in - (uVar1 >> 0x10);
    iVar10 = -iVar11;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    if (uVar1 >> 0x10 != (uint)(ushort)in || (uVar1 & 0xffff) != (uint)uVar3) {
      if (local_21c < 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar16);
        std::operator<<((ostream *)local_1a8,", expected packHalf2x16(");
        tcu::operator<<((ostream *)local_1a8,
                        inputs.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar16);
        std::operator<<((ostream *)local_1a8,") = ");
        hex_00.value._2_2_ = uVar4;
        hex_00.value._0_2_ = uVar3;
        hex_00.value._4_4_ = 0;
        tcu::Format::operator<<((ostream *)local_1a8,hex_00);
        std::operator<<((ostream *)local_1a8,", got ");
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,"\n  diffs = (");
        std::ostream::operator<<(local_1a8,iVar15);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,iVar10);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::operator<<(local_1a8,0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (local_21c == 10) {
        in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      local_21c = local_21c + 1;
    }
  }
  in = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar15 = (int)(uVar12 >> 3);
  std::ostream::operator<<(local_1a8,iVar15 - local_21c);
  std::operator<<((ostream *)local_1a8," / ");
  std::ostream::operator<<(local_1a8,iVar15);
  std::operator<<((ostream *)local_1a8," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  description = "Pass";
  if (local_21c != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(local_21c != 0),description);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&outputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&inputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}